

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int compute_num_enc_workers(AV1_COMP *cpi,int max_workers)

{
  AV1_COMMON *cm;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int row;
  int col;
  int col_00;
  TileInfo local_48;
  
  if (max_workers < 2) {
    return 1;
  }
  if ((cpi->oxcf).row_mt == true) {
    cm = &cpi->common;
    iVar3 = (cpi->common).tiles.cols;
    iVar4 = (cpi->common).tiles.rows;
    row = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    iVar5 = 0;
    for (; row != iVar4; row = row + 1) {
      for (col_00 = 0; iVar3 != col_00; col_00 = col_00 + 1) {
        av1_tile_init(&local_48,cm,row,col_00);
        iVar1 = av1_get_sb_rows_in_tile(cm,&local_48);
        iVar2 = av1_get_sb_cols_in_tile(cm,&local_48);
        iVar2 = iVar2 + 1 >> 1;
        if (iVar1 <= iVar2) {
          iVar2 = iVar1;
        }
        iVar5 = iVar5 + iVar2;
      }
    }
    if (iVar5 < max_workers) {
      max_workers = iVar5;
    }
    return max_workers;
  }
  iVar3 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  if (max_workers <= iVar3) {
    iVar3 = max_workers;
  }
  return iVar3;
}

Assistant:

static int compute_num_enc_workers(const AV1_COMP *cpi, int max_workers) {
  if (max_workers <= 1) return 1;
  if (cpi->oxcf.row_mt)
    return compute_num_enc_row_mt_workers(&cpi->common, max_workers);
  else
    return compute_num_enc_tile_mt_workers(&cpi->common, max_workers);
}